

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O1

Btor2Line * btor2parser_iter_next(Btor2LineIterator *it)

{
  long lVar1;
  Btor2Line **ppBVar2;
  long lVar3;
  Btor2Line *pBVar4;
  int64_t res;
  long lVar5;
  
  lVar1 = it->next;
  if (lVar1 == 0) {
    return (Btor2Line *)0x0;
  }
  ppBVar2 = it->reader->table;
  lVar3 = it->reader->ntable;
  lVar5 = lVar1 + 1;
  if (lVar5 < lVar3) {
    do {
      if (ppBVar2[lVar5] != (Btor2Line *)0x0) goto LAB_00102709;
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
  }
  lVar5 = 0;
LAB_00102709:
  pBVar4 = ppBVar2[lVar1];
  it->next = lVar5;
  return pBVar4;
}

Assistant:

Btor2Line *
btor2parser_iter_next (Btor2LineIterator *it)
{
  Btor2Line *res;
  if (!it->next) return 0;
  assert (0 < it->next);
  assert (it->next < it->reader->ntable);
  res      = it->reader->table[it->next];
  it->next = find_non_zero_line_bfr (it->reader, it->next + 1);
  return res;
}